

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

int load_data(void)

{
  char *in_stack_00000010;
  char *in_stack_00000018;
  undefined4 local_4;
  
  if (demo_data == (DATA_ENTRY *)0x0) {
    demo_data = load_data_entries(in_stack_00000010);
    if (demo_data == (DATA_ENTRY *)0x0) {
      local_4 = 6;
    }
    else {
      GameError = load_game_resources(in_stack_00000018);
      if (GameError == (char *)0x0) {
        local_4 = 0;
      }
      else {
        local_4 = 7;
      }
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int load_data(void)
{
   if (demo_data)
      return DEMO_OK;

   /* Load the data for the game menus. */
   demo_data = load_data_entries(data_path);
   if (demo_data == 0) {
      return DEMO_ERROR_DATA;
   }

   /* Load other game resources. */
   if ((GameError = load_game_resources(data_path)))
      return DEMO_ERROR_GAMEDATA;

   return DEMO_OK;
}